

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getStencilName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkStencilOpState *stencilOpState)

{
  ostream *poVar1;
  char *pcVar2;
  string local_1f0;
  string local_1d0;
  string fullName;
  ostringstream name;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
  poVar1 = std::operator<<((ostream *)&name,"fail_");
  pcVar2 = pipeline::anon_unknown_0::getShortName(*(VkStencilOp *)this);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"_pass_");
  pcVar2 = pipeline::anon_unknown_0::getShortName(*(VkStencilOp *)(this + 4));
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"_dfail_");
  pcVar2 = pipeline::anon_unknown_0::getShortName(*(VkStencilOp *)(this + 8));
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"_comp_");
  pcVar2 = ::vk::getCompareOpName(*(VkCompareOp *)(this + 0xc));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,pcVar2,(allocator<char> *)&local_1f0);
  std::__cxx11::string::substr((ulong)&local_1f0,(ulong)&fullName);
  de::toLower(&local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&fullName);
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string getStencilName(const VkStencilOpState& stencilOpState)
{
	std::ostringstream name;

	name << "fail_" << getShortName(stencilOpState.failOp)
		 << "_pass_" << getShortName(stencilOpState.passOp)
		 << "_dfail_" << getShortName(stencilOpState.depthFailOp)
		 << "_comp_" << getShortName(stencilOpState.compareOp);

	return name.str();
}